

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O1

void duckdb::BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::Free(ART *art,Node *node)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  type paVar3;
  long *plVar4;
  pointer this;
  data_ptr_t pdVar5;
  __hash_code __code;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  Node *node_00;
  long lVar9;
  
  uVar8 = (node->super_IndexPointer).data;
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var1._M_head_impl =
       paVar3->_M_elems[2].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar6 = uVar8 & 0xffffffff;
  plVar4 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                     (uVar6 % *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
  for (plVar7 = (long *)*plVar4; uVar6 != plVar7[1]; plVar7 = (long *)*plVar7) {
    plVar4 = plVar7;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar4 + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this,true);
  lVar9 = (ulong)((uint)(uVar8 >> 0x20) & 0xffffff) * (_Var1._M_head_impl)->segment_size;
  iVar2 = (_Var1._M_head_impl)->bitmask_offset;
  if (pdVar5[iVar2 + lVar9] != '\0') {
    uVar8 = 0;
    node_00 = (Node *)(pdVar5 + iVar2 + lVar9);
    do {
      node_00 = node_00 + 1;
      Node::Free(art,node_00);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (byte)(((Node *)(pdVar5 + iVar2 + lVar9))->super_IndexPointer).data);
  }
  return;
}

Assistant:

static void Free(ART &art, Node &node) {
		auto &n = Node::Ref<BaseNode>(art, node, TYPE);
		for (uint8_t i = 0; i < n.count; i++) {
			Node::Free(art, n.children[i]);
		}
	}